

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

Result<int> * SighashFromStr(string *sighash)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  bool bVar1;
  int iVar2;
  Result<int> *in_RDI;
  long in_FS_OFFSET;
  const_iterator *it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_fffffffffffffc18;
  T obj;
  Result<int> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc48;
  allocator_type *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  iterator ppVar4;
  undefined1 *puVar5;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [15];
  allocator<char> local_2a9;
  undefined4 local_2a8;
  allocator<char> local_2a1;
  undefined4 local_2a0;
  allocator<char> local_299;
  undefined4 local_298;
  allocator<char> local_291;
  undefined4 local_290;
  allocator<char> local_289;
  undefined4 local_288;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [2];
  Result<int> local_240 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [7];
  undefined1 local_30 [40];
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  if (SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&SighashFromStr(std::__cxx11::string_const&)::
                                 map_sighash_values_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_288 = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_290 = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_298 = 0x81;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_2a0 = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_2a8 = 0x82;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_2b8._8_4_ = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      puVar5 = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      local_2b8._0_4_ = 0x83;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                 (int *)in_stack_fffffffffffffc08);
      ppVar4 = (iterator)(local_2c8 + 0xe);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                   *)in_stack_fffffffffffffc08);
      __l._M_len = (size_type)puVar5;
      __l._M_array = ppVar4;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::map(in_stack_fffffffffffffc60,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)in_stack_fffffffffffffc08);
      pbVar3 = local_120;
      local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffff8;
      do {
        in_stack_fffffffffffffc58 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_398[-2].field_2 + 8);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::~pair(in_stack_fffffffffffffc08);
        local_398 = in_stack_fffffffffffffc58;
      } while (in_stack_fffffffffffffc58 != pbVar3);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator((allocator<char> *)(local_2b8 + 7));
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_2a9);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_2a1);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_291);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_289);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
      std::allocator<char>::~allocator(&local_281);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::~map,&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_);
    }
  }
  local_2c8._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)in_stack_fffffffffffffc10,&in_stack_fffffffffffffc08->first);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)in_stack_fffffffffffffc10);
  bVar1 = std::operator==((_Self *)in_stack_fffffffffffffc18,(_Self *)in_stack_fffffffffffffc10);
  obj = (T)((ulong)in_stack_fffffffffffffc18 >> 0x20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this = local_240;
    __lhs = local_280;
    std::operator+((char *)in_stack_fffffffffffffc58,pbVar3);
    std::operator+(__lhs,(char *)this);
    Untranslated(in_stack_fffffffffffffc40);
    util::Result<int>::Result(this,(Error *)in_stack_fffffffffffffc10);
    util::Error::~Error((Error *)in_stack_fffffffffffffc08);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc08->first);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)in_stack_fffffffffffffc08);
    util::Result<int>::Result((Result<int> *)in_stack_fffffffffffffc10,obj);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<int> SighashFromStr(const std::string& sighash)
{
    static const std::map<std::string, int> map_sighash_values = {
        {std::string("DEFAULT"), int(SIGHASH_DEFAULT)},
        {std::string("ALL"), int(SIGHASH_ALL)},
        {std::string("ALL|ANYONECANPAY"), int(SIGHASH_ALL|SIGHASH_ANYONECANPAY)},
        {std::string("NONE"), int(SIGHASH_NONE)},
        {std::string("NONE|ANYONECANPAY"), int(SIGHASH_NONE|SIGHASH_ANYONECANPAY)},
        {std::string("SINGLE"), int(SIGHASH_SINGLE)},
        {std::string("SINGLE|ANYONECANPAY"), int(SIGHASH_SINGLE|SIGHASH_ANYONECANPAY)},
    };
    const auto& it = map_sighash_values.find(sighash);
    if (it != map_sighash_values.end()) {
        return it->second;
    } else {
        return util::Error{Untranslated("'" + sighash + "' is not a valid sighash parameter.")};
    }
}